

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 whereIsCoveringIndex(WhereInfo *pWInfo,Index *pIdx,int iTabCur)

{
  undefined1 local_68 [8];
  Walker w;
  CoveringIndexCheck ck;
  int i;
  int iTabCur_local;
  Index *pIdx_local;
  WhereInfo *pWInfo_local;
  
  if (pWInfo->pSelect == (Select *)0x0) {
    pWInfo_local._4_4_ = 1;
  }
  else {
    for (ck.iTabCur = 0;
        (ck.iTabCur < (int)(uint)pIdx->nColumn && (pIdx->aiColumn[ck.iTabCur] < 0x3f));
        ck.iTabCur = ck.iTabCur + 1) {
    }
    if (ck.iTabCur < (int)(uint)pIdx->nColumn) {
      w.u = (anon_union_8_17_dfc45e9e_for_u)pIdx;
      memset(local_68,0,0x30);
      w.pParse = (Parse *)whereIsCoveringIndexWalkCallback;
      w.xExprCallback = sqlite3SelectWalkNoop;
      w._32_8_ = &w.u;
      w.xSelectCallback2._4_2_ = 0;
      sqlite3WalkSelect((Walker *)local_68,pWInfo->pSelect);
      pWInfo_local._4_4_ = (uint)w.xSelectCallback2._4_2_;
    }
    else {
      pWInfo_local._4_4_ = 1;
    }
  }
  return pWInfo_local._4_4_;
}

Assistant:

static SQLITE_NOINLINE u32 whereIsCoveringIndex(
  WhereInfo *pWInfo,     /* The WHERE clause context */
  Index *pIdx,           /* Index that is being tested */
  int iTabCur            /* Cursor for the table being indexed */
){
  int i;
  struct CoveringIndexCheck ck;
  Walker w;
  if( pWInfo->pSelect==0 ){
    /* We don't have access to the full query, so we cannot check to see
    ** if pIdx is covering.  Assume it is not. */
    return 1;
  }
  for(i=0; i<pIdx->nColumn; i++){
    if( pIdx->aiColumn[i]>=BMS-1 ) break;
  }
  if( i>=pIdx->nColumn ){
    /* pIdx does not index any columns greater than 62, but we know from
    ** colMask that columns greater than 62 are used, so this is not a
    ** covering index */
    return 1;
  }
  ck.pIdx = pIdx;
  ck.iTabCur = iTabCur;
  memset(&w, 0, sizeof(w));
  w.xExprCallback = whereIsCoveringIndexWalkCallback;
  w.xSelectCallback = sqlite3SelectWalkNoop;
  w.u.pCovIdxCk = &ck;
  w.eCode = 0;
  sqlite3WalkSelect(&w, pWInfo->pSelect);
  return w.eCode;
}